

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

void xmlOutputBufferWriteWSNonSig(xmlSaveCtxtPtr ctxt,int extra)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if ((ctxt != (xmlSaveCtxtPtr)0x0) && (ctxt->buf != (xmlOutputBufferPtr)0x0)) {
    xmlOutputBufferWrite(ctxt->buf,1,"\n");
    iVar3 = ctxt->level + extra;
    if (iVar3 != 0 && SCARRY4(ctxt->level,extra) == iVar3 < 0) {
      iVar1 = ctxt->indent_nr;
      iVar2 = 0;
      do {
        iVar4 = iVar3 - iVar2;
        if (iVar1 <= iVar3 - iVar2) {
          iVar4 = iVar1;
        }
        xmlOutputBufferWrite(ctxt->buf,iVar4 * ctxt->indent_size,ctxt->indent);
        iVar1 = ctxt->indent_nr;
        iVar2 = iVar2 + iVar1;
        iVar3 = ctxt->level + extra;
      } while (iVar2 < iVar3);
    }
  }
  return;
}

Assistant:

static void
xmlOutputBufferWriteWSNonSig(xmlSaveCtxtPtr ctxt, int extra)
{
    int i;
    if ((ctxt == NULL) || (ctxt->buf == NULL))
        return;
    xmlOutputBufferWrite(ctxt->buf, 1, "\n");
    for (i = 0; i < (ctxt->level + extra); i += ctxt->indent_nr) {
        xmlOutputBufferWrite(ctxt->buf, ctxt->indent_size *
                ((ctxt->level + extra - i) > ctxt->indent_nr ?
                 ctxt->indent_nr : (ctxt->level + extra - i)),
                ctxt->indent);
    }
}